

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall
fasttext::ProductQuantizer::addcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  uint uVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  real *prVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar7 = (ulong)this->dsub_;
  uVar1 = this->nsubq_;
  lVar5 = uVar7 * 4;
  lVar8 = 0;
  for (uVar9 = 0; uVar9 != (~((int)uVar1 >> 0x1f) & uVar1); uVar9 = uVar9 + 1) {
    prVar4 = get_centroids(this,(int32_t)uVar9,codes[uVar9 + (long)(int)(t * uVar1)]);
    if (uVar9 == uVar1 - 1) {
      uVar7 = (ulong)(uint)this->lastdsub_;
    }
    pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar6 = 0; (~((int)(uint)uVar7 >> 0x1f) & (uint)uVar7) != uVar6; uVar6 = uVar6 + 1) {
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)prVar4[uVar6]),ZEXT416((uint)alpha),
                               ZEXT416(*(uint *)((long)pfVar2 + uVar6 * 4 + lVar8)));
      *(int *)((long)pfVar2 + uVar6 * 4 + lVar8) = auVar3._0_4_;
    }
    lVar8 = lVar8 + lVar5;
  }
  return;
}

Assistant:

void ProductQuantizer::addcode(
    Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      x[m * dsub_ + n] += alpha * c[n];
    }
  }
}